

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ImDrawList *pIVar7;
  void *pvVar8;
  ImDrawCmd *pIVar9;
  float in_ECX;
  float *in_RDX;
  ImVector<ImDrawCmd> *in_RSI;
  ImFont *in_RDI;
  float *in_R8;
  ImDrawList *in_R9;
  float in_XMM0_Da;
  float fVar10;
  float fVar11;
  float fVar12;
  float in_XMM1_Da;
  ImDrawList *in_stack_00000008;
  byte in_stack_00000010;
  ImU32 glyph_col;
  float v2;
  float u2;
  float v1;
  float u1;
  float y2;
  float y1;
  float x2;
  float x1;
  float char_width;
  ImFontGlyph *glyph;
  uint c;
  char *word_wrap_eol;
  ImU32 col_untinted;
  uint vtx_index;
  uint *idx_write;
  ImDrawVert *vtx_write;
  int idx_expected_size;
  int idx_count_max;
  int vtx_count_max;
  float y_end;
  char *s_end;
  char *line_end;
  char *s;
  bool word_wrap_enabled;
  float line_height;
  float scale;
  float start_x;
  float y;
  float x;
  undefined4 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  ImDrawList *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  ImDrawList *in_stack_fffffffffffffef0;
  ImDrawList *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  ImFontGlyph *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  ImDrawList *local_a0;
  float local_94;
  ImDrawCmd *local_90;
  float *local_88;
  float local_74;
  ImDrawList *local_70;
  ImDrawList *local_60;
  float local_48;
  float local_44;
  
  if (in_stack_00000008 == (ImDrawList *)0x0) {
    sVar6 = strlen((char *)in_R9);
    in_stack_00000008 = (ImDrawList *)((long)&(in_R9->CmdBuffer).Size + sVar6);
  }
  fVar10 = (float)(int)*in_RDX;
  local_48 = (float)(int)in_RDX[1];
  if (local_48 < in_R8[3] || local_48 == in_R8[3]) {
    fVar11 = in_XMM0_Da / in_RDI->FontSize;
    fVar12 = in_RDI->FontSize * fVar11;
    bVar1 = 0.0 < in_XMM1_Da;
    local_60 = in_R9;
    if (local_48 + fVar12 < in_R8[1]) {
      for (; local_48 + fVar12 < in_R8[1] && local_60 < in_stack_00000008;
          local_48 = fVar12 + local_48) {
        pIVar7 = (ImDrawList *)memchr(local_60,10,(long)in_stack_00000008 - (long)local_60);
        if (bVar1) {
          in_stack_fffffffffffffef8 = in_stack_00000008;
          if (pIVar7 != (ImDrawList *)0x0) {
            in_stack_fffffffffffffef8 = pIVar7;
          }
          in_stack_ffffffffffffff04 = fVar11;
          CalcWordWrapPositionA
                    ((ImFont *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (float)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                     (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff3c);
          local_60 = (ImDrawList *)
                     CalcWordWrapNextLineStartA
                               ((char *)in_stack_fffffffffffffee0,
                                (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8
                                                ));
        }
        else {
          in_stack_fffffffffffffef0 = in_stack_00000008;
          local_60 = in_stack_00000008;
          if (pIVar7 != (ImDrawList *)0x0) {
            local_60 = (ImDrawList *)((long)&(pIVar7->CmdBuffer).Size + 1);
            in_stack_fffffffffffffef0 = local_60;
          }
        }
      }
    }
    if ((10000 < (long)in_stack_00000008 - (long)local_60) && (!bVar1)) {
      local_70 = local_60;
      local_74 = local_48;
      while( true ) {
        uVar3 = in_stack_fffffffffffffeec & 0xffffff;
        if (local_74 < in_R8[3]) {
          uVar3 = CONCAT13(local_70 < in_stack_00000008,(int3)in_stack_fffffffffffffeec);
        }
        in_stack_fffffffffffffeec = uVar3;
        if ((char)(in_stack_fffffffffffffeec >> 0x18) == '\0') break;
        pvVar8 = memchr(local_70,10,(long)in_stack_00000008 - (long)local_70);
        in_stack_fffffffffffffee0 = in_stack_00000008;
        if (pvVar8 != (void *)0x0) {
          in_stack_fffffffffffffee0 = (ImDrawList *)((long)pvVar8 + 1);
        }
        local_74 = fVar12 + local_74;
        local_70 = in_stack_fffffffffffffee0;
      }
      in_stack_00000008 = local_70;
    }
    if (local_60 != in_stack_00000008) {
      iVar2 = (int)local_60;
      iVar5 = in_RSI[1].Size;
      ImDrawList::PrimReserve
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      local_88 = *(float **)(in_RSI + 4);
      local_90 = in_RSI[4].Data;
      local_94 = (float)in_RSI[3].Capacity;
      local_a0 = (ImDrawList *)0x0;
      local_44 = fVar10;
LAB_00225ad5:
      do {
        if (in_stack_00000008 <= local_60) break;
        if (bVar1) {
          if (local_a0 == (ImDrawList *)0x0) {
            local_a0 = (ImDrawList *)
                       CalcWordWrapPositionA
                                 ((ImFont *)
                                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                  (float)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                  (char *)CONCAT44(in_stack_ffffffffffffff4c,
                                                   in_stack_ffffffffffffff48),
                                  (char *)CONCAT44(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff3c);
          }
          if (local_a0 <= local_60) {
            local_48 = fVar12 + local_48;
            if (in_R8[3] <= local_48 && local_48 != in_R8[3]) break;
            local_a0 = (ImDrawList *)0x0;
            local_60 = (ImDrawList *)
                       CalcWordWrapNextLineStartA
                                 ((char *)in_stack_fffffffffffffee0,
                                  (char *)CONCAT44(in_stack_fffffffffffffedc,
                                                   in_stack_fffffffffffffed8));
            local_44 = fVar10;
            goto LAB_00225ad5;
          }
        }
        in_stack_ffffffffffffff5c = (uint)(char)(local_60->CmdBuffer).Size;
        if (in_stack_ffffffffffffff5c < 0x80) {
          local_60 = (ImDrawList *)((long)&(local_60->CmdBuffer).Size + 1);
        }
        else {
          iVar4 = ImTextCharFromUtf8((uint *)CONCAT44(in_stack_ffffffffffffff04,
                                                      in_stack_ffffffffffffff00),
                                     (char *)in_stack_fffffffffffffef8,
                                     (char *)in_stack_fffffffffffffef0);
          local_60 = (ImDrawList *)((long)&(local_60->CmdBuffer).Size + (long)iVar4);
        }
        if (0x1f < in_stack_ffffffffffffff5c) {
LAB_00225cb6:
          in_stack_ffffffffffffff50 = FindGlyph(in_RDI,(ImWchar)in_stack_ffffffffffffff5c);
          if (in_stack_ffffffffffffff50 != (ImFontGlyph *)0x0) {
            in_stack_ffffffffffffff4c = in_stack_ffffffffffffff50->AdvanceX * fVar11;
            if ((*(uint *)in_stack_ffffffffffffff50 >> 1 & 1) != 0) {
              in_stack_ffffffffffffff48 = in_stack_ffffffffffffff50->X0 * fVar11 + local_44;
              in_stack_ffffffffffffff44 = in_stack_ffffffffffffff50->X1 * fVar11 + local_44;
              in_stack_ffffffffffffff40 = in_stack_ffffffffffffff50->Y0 * fVar11 + local_48;
              in_stack_ffffffffffffff3c = in_stack_ffffffffffffff50->Y1 * fVar11 + local_48;
              if ((in_stack_ffffffffffffff48 <= in_R8[2]) && (*in_R8 <= in_stack_ffffffffffffff44))
              {
                local_c8 = in_stack_ffffffffffffff50->U0;
                local_cc = in_stack_ffffffffffffff50->V0;
                local_d0 = in_stack_ffffffffffffff50->U1;
                local_d4 = in_stack_ffffffffffffff50->V1;
                if ((in_stack_00000010 & 1) != 0) {
                  if (in_stack_ffffffffffffff48 < *in_R8) {
                    local_c8 = (1.0 - (in_stack_ffffffffffffff44 - *in_R8) /
                                      (in_stack_ffffffffffffff44 - in_stack_ffffffffffffff48)) *
                               (local_d0 - local_c8) + local_c8;
                    in_stack_ffffffffffffff48 = *in_R8;
                  }
                  if (in_stack_ffffffffffffff40 < in_R8[1]) {
                    local_cc = (1.0 - (in_stack_ffffffffffffff3c - in_R8[1]) /
                                      (in_stack_ffffffffffffff3c - in_stack_ffffffffffffff40)) *
                               (local_d4 - local_cc) + local_cc;
                    in_stack_ffffffffffffff40 = in_R8[1];
                  }
                  if (in_R8[2] <= in_stack_ffffffffffffff44 && in_stack_ffffffffffffff44 != in_R8[2]
                     ) {
                    local_d0 = ((in_R8[2] - in_stack_ffffffffffffff48) /
                               (in_stack_ffffffffffffff44 - in_stack_ffffffffffffff48)) *
                               (local_d0 - local_c8) + local_c8;
                    in_stack_ffffffffffffff44 = in_R8[2];
                  }
                  if (in_R8[3] <= in_stack_ffffffffffffff3c && in_stack_ffffffffffffff3c != in_R8[3]
                     ) {
                    local_d4 = ((in_R8[3] - in_stack_ffffffffffffff40) /
                               (in_stack_ffffffffffffff3c - in_stack_ffffffffffffff40)) *
                               (local_d4 - local_cc) + local_cc;
                    in_stack_ffffffffffffff3c = in_R8[3];
                  }
                  if (in_stack_ffffffffffffff3c <= in_stack_ffffffffffffff40) {
                    local_44 = in_stack_ffffffffffffff4c + local_44;
                    goto LAB_00225ad5;
                  }
                }
                in_stack_fffffffffffffedc = in_ECX;
                if (((undefined1  [40])*in_stack_ffffffffffffff50 & (undefined1  [40])0x1) !=
                    (undefined1  [40])0x0) {
                  in_stack_fffffffffffffedc = (float)((uint)in_ECX | 0xffffff);
                }
                *local_88 = in_stack_ffffffffffffff48;
                local_88[1] = in_stack_ffffffffffffff40;
                local_88[4] = in_stack_fffffffffffffedc;
                local_88[2] = local_c8;
                local_88[3] = local_cc;
                local_88[5] = in_stack_ffffffffffffff44;
                local_88[6] = in_stack_ffffffffffffff40;
                local_88[9] = in_stack_fffffffffffffedc;
                local_88[7] = local_d0;
                local_88[8] = local_cc;
                local_88[10] = in_stack_ffffffffffffff44;
                local_88[0xb] = in_stack_ffffffffffffff3c;
                local_88[0xe] = in_stack_fffffffffffffedc;
                local_88[0xc] = local_d0;
                local_88[0xd] = local_d4;
                local_88[0xf] = in_stack_ffffffffffffff48;
                local_88[0x10] = in_stack_ffffffffffffff3c;
                local_88[0x13] = in_stack_fffffffffffffedc;
                local_88[0x11] = local_c8;
                local_88[0x12] = local_d4;
                (local_90->ClipRect).x = local_94;
                (local_90->ClipRect).y = (float)((int)local_94 + 1);
                (local_90->ClipRect).z = (float)((int)local_94 + 2);
                (local_90->ClipRect).w = local_94;
                *(int *)&local_90->TextureId = (int)local_94 + 2;
                *(int *)((long)&local_90->TextureId + 4) = (int)local_94 + 3;
                local_88 = local_88 + 0x14;
                local_94 = (float)((int)local_94 + 4);
                local_90 = (ImDrawCmd *)&local_90->VtxOffset;
              }
            }
            local_44 = in_stack_ffffffffffffff4c + local_44;
          }
          goto LAB_00225ad5;
        }
        if (in_stack_ffffffffffffff5c != 10) {
          if (in_stack_ffffffffffffff5c != 0xd) goto LAB_00225cb6;
          goto LAB_00225ad5;
        }
        local_48 = fVar12 + local_48;
        local_44 = fVar10;
      } while (local_48 < in_R8[3] || local_48 == in_R8[3]);
      in_RSI[2].Size = (int)(((long)local_88 - (long)in_RSI[2].Data) / 0x14);
      in_RSI[1].Size = (int)((long)local_90 - (long)in_RSI[1].Data >> 2);
      iVar5 = (iVar5 + ((int)in_stack_00000008 - iVar2) * 6) - in_RSI[1].Size;
      pIVar9 = ImVector<ImDrawCmd>::operator[](in_RSI,in_RSI->Size + -1);
      pIVar9->ElemCount = pIVar9->ElemCount - iVar5;
      *(float **)(in_RSI + 4) = local_88;
      in_RSI[4].Data = local_90;
      in_RSI[3].Capacity = (int)local_94;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    float x = IM_TRUNC(pos.x);
    float y = IM_TRUNC(pos.y);
    if (y > clip_rect.w)
        return;

    const float start_x = x;
    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            const char* line_end = (const char*)memchr(s, '\n', text_end - s);
            if (word_wrap_enabled)
            {
                // FIXME-OPT: This is not optimal as do first do a search for \n before calling CalcWordWrapPositionA().
                // If the specs for CalcWordWrapPositionA() were reworked to optionally return on \n we could combine both.
                // However it is still better than nothing performing the fast-forward!
                s = CalcWordWrapPositionA(scale, s, line_end ? line_end : text_end, wrap_width);
                s = CalcWordWrapNextLineStartA(s, text_end);
            }
            else
            {
                s = line_end ? line_end + 1 : text_end;
            }
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);
    ImDrawVert*  vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx*   idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_index = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;
    const char* word_wrap_eol = NULL;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - start_x));

            if (s >= word_wrap_eol)
            {
                x = start_x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                word_wrap_eol = NULL;
                s = CalcWordWrapNextLineStartA(s, text_end); // Wrapping skips upcoming blanks
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
            s += 1;
        else
            s += ImTextCharFromUtf8(&c, s, text_end);

        if (c < 32)
        {
            if (c == '\n')
            {
                x = start_x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    idx_write[0] = (ImDrawIdx)(vtx_index); idx_write[1] = (ImDrawIdx)(vtx_index + 1); idx_write[2] = (ImDrawIdx)(vtx_index + 2);
                    idx_write[3] = (ImDrawIdx)(vtx_index); idx_write[4] = (ImDrawIdx)(vtx_index + 2); idx_write[5] = (ImDrawIdx)(vtx_index + 3);
                    vtx_write += 4;
                    vtx_index += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_index;
}